

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

int Abc_TruthNpnCountUniqueSort(Abc_TtStore_t *p)

{
  int iVar1;
  int local_18;
  int local_14;
  int k;
  int i;
  Abc_TtStore_t *p_local;
  
  nWords = p->nWords;
  if (0 < nWords) {
    qsort(p->pFuncs,(long)p->nFuncs,8,Abc_TruthCompare);
    local_18 = 1;
    for (local_14 = 1; local_14 < p->nFuncs; local_14 = local_14 + 1) {
      iVar1 = memcmp(p->pFuncs[local_14 + -1],p->pFuncs[local_14],(long)nWords << 3);
      if (iVar1 != 0) {
        p->pFuncs[local_18] = p->pFuncs[local_14];
        local_18 = local_18 + 1;
      }
    }
    p->nFuncs = local_18;
    return local_18;
  }
  __assert_fail("nWords > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                ,0x86,"int Abc_TruthNpnCountUniqueSort(Abc_TtStore_t *)");
}

Assistant:

int Abc_TruthNpnCountUniqueSort( Abc_TtStore_t * p )
{
    int i, k;
    // sort them by value
    nWords = p->nWords;
    assert( nWords > 0 );
    qsort( (void *)p->pFuncs, (size_t)p->nFuncs, sizeof(word *), (int(*)(const void *,const void *))Abc_TruthCompare );
    // count the number of unqiue functions
    for ( i = k = 1; i < p->nFuncs; i++ )
        if ( memcmp( p->pFuncs[i-1], p->pFuncs[i], sizeof(word) * nWords ) )
            p->pFuncs[k++] = p->pFuncs[i];
    return (p->nFuncs = k);
}